

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O0

bool __thiscall Clasp::mt::ParallelHandler::attach(ParallelHandler *this,SharedContext *ctx)

{
  bool bVar1;
  SolveParams *pSVar2;
  Distributor *pDVar3;
  void *pvVar4;
  SharedContext *in_RSI;
  long in_RDI;
  Solver *unaff_retaddr;
  char *in_stack_00000008;
  SharedContext *in_stack_00000010;
  undefined4 in_stack_ffffffffffffffd8;
  uint32 in_stack_ffffffffffffffdc;
  Solver *in_stack_ffffffffffffffe0;
  
  GP::reset((GP *)(in_RDI + 0x18),0xffffffffffffffff,gp_none);
  *(uint *)(in_RDI + 0x58) = *(uint *)(in_RDI + 0x58) & 0xf0000000;
  *(uint *)(in_RDI + 0x58) = *(uint *)(in_RDI + 0x58) & 0xefffffff;
  *(uint *)(in_RDI + 0x58) = *(uint *)(in_RDI + 0x58) & 0xdfffffff;
  *(uint *)(in_RDI + 0x58) = *(uint *)(in_RDI + 0x58) & 0xbfffffff;
  pSVar2 = Solver::searchConfig(in_stack_ffffffffffffffe0);
  *(uint *)(in_RDI + 0x58) =
       *(uint *)(in_RDI + 0x58) & 0x7fffffff |
       (uint)(((uint)(pSVar2->reduce).strategy >> 7 & 0xf) != 0) << 0x1f;
  *(undefined8 *)(in_RDI + 8) = 0;
  if (*(long *)(in_RDI + 0x38) == 0) {
    pDVar3 = SingleOwnerPtr<Clasp::Distributor,_Clasp::DeleteObject>::get
                       ((SingleOwnerPtr<Clasp::Distributor,_Clasp::DeleteObject> *)0x21d0e5);
    if (pDVar3 != (Distributor *)0x0) {
      pvVar4 = operator_new__(0x100);
      *(void **)(in_RDI + 0x38) = pvVar4;
    }
  }
  SharedContext::report(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  Solver::addPost(in_stack_ffffffffffffffe0,
                  (PostPropagator *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  Solver::id(*(Solver **)(in_RDI + 0x30));
  bVar1 = SharedContext::attach(in_RSI,in_stack_ffffffffffffffdc);
  return bVar1;
}

Assistant:

bool ParallelHandler::attach(SharedContext& ctx) {
	assert(solver_);
	gp_.reset();
	error_ = 0;
	win_   = 0;
	up_    = 0;
	act_   = 0;
	lbd_   = solver_->searchConfig().reduce.strategy.glue != 0;
	next   = 0;
	if (!received_ && ctx.distributor.get()) {
		received_ = new SharedLiterals*[RECEIVE_BUFFER_SIZE];
	}
	ctx.report("attach", solver_);
	solver_->addPost(this);
	return ctx.attach(solver_->id());
}